

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenUnionInit
          (PythonGenerator *this,FieldDef *field,string *field_types_ptr,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_list,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_typing_list)

{
  int iVar1;
  undefined8 uVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  bool bVar4;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar5;
  reference ppEVar6;
  long lVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  string package_reference_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string package_reference;
  undefined1 local_e8 [8];
  string field_type;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_b8;
  const_iterator it;
  EnumDef *enum_def;
  undefined1 local_a0 [8];
  string separator_string;
  string *field_types;
  allocator<char> local_51;
  value_type local_50;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *import_typing_list_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *import_list_local;
  string *field_types_ptr_local;
  FieldDef *field_local;
  PythonGenerator *this_local;
  
  local_30 = import_typing_list;
  import_typing_list_local = import_list;
  import_list_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)field_types_ptr;
  field_types_ptr_local = (string *)field;
  field_local = (FieldDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Union",&local_51);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(import_typing_list,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  separator_string.field_2._8_8_ = import_list_local;
  std::__cxx11::string::operator=((string *)import_list_local,"Union[");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,", ",(allocator<char> *)((long)&enum_def + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&enum_def + 7));
  it._M_current = *(EnumVal ***)((long)&field_types_ptr_local[6].field_2 + 8);
  pvVar5 = EnumDef::Vals((EnumDef *)it._M_current);
  local_b8._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar5);
  while( true ) {
    pvVar5 = EnumDef::Vals((EnumDef *)it._M_current);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar5);
    bVar4 = __gnu_cxx::operator!=
                      (&local_b8,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev);
    uVar2 = separator_string.field_2._8_8_;
    if (!bVar4) break;
    ppEVar6 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_b8);
    field_type.field_2._8_8_ = *ppEVar6;
    std::__cxx11::string::string((string *)local_e8);
    iVar1 = *(int *)(field_type.field_2._8_8_ + 0x38);
    if (iVar1 == 0) {
      std::__cxx11::string::operator+=((string *)local_e8,"None");
    }
    else if (iVar1 == 0xd) {
      std::__cxx11::string::operator+=((string *)local_e8,"str");
    }
    else if (iVar1 == 0xf) {
      IdlNamer::ObjectType_abi_cxx11_
                ((string *)((long)&package_reference.field_2 + 8),&this->namer_,
                 *(StructDef **)(field_type.field_2._8_8_ + 0x40));
      std::__cxx11::string::operator=
                ((string *)local_e8,(string *)(package_reference.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(package_reference.field_2._M_local_buf + 8));
      if (((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) {
        GenPackageReference_abi_cxx11_
                  ((string *)local_128,this,(Type *)(field_type.field_2._8_8_ + 0x38));
        std::operator+(&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128,".");
        std::operator+(&local_148,&local_168,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                      );
        std::__cxx11::string::operator=((string *)local_e8,(string *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        psVar3 = import_typing_list_local;
        std::operator+(&local_188,"import ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_128);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(psVar3,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)local_128);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&package_reference_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::operator+=
              ((string *)separator_string.field_2._8_8_,
               (string *)(package_reference_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(package_reference_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_e8);
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_b8);
  }
  lVar7 = std::__cxx11::string::length();
  lVar8 = std::__cxx11::string::size();
  std::__cxx11::string::erase(uVar2,lVar7 - lVar8);
  std::__cxx11::string::operator+=((string *)separator_string.field_2._8_8_,"]");
  if (((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) {
    GenPackageReference_abi_cxx11_
              ((string *)local_1d8,this,(Type *)&field_types_ptr_local[6]._M_string_length);
    psVar3 = import_typing_list_local;
    std::operator+(&local_1f8,"import ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(psVar3,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

void GenUnionInit(const FieldDef &field, std::string *field_types_ptr,
                    std::set<std::string> *import_list,
                    std::set<std::string> *import_typing_list) const {
    // Gets all possible types in the union.
    import_typing_list->insert("Union");
    auto &field_types = *field_types_ptr;
    field_types = "Union[";

    std::string separator_string = ", ";
    auto enum_def = field.value.type.enum_def;
    for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
         ++it) {
      auto &ev = **it;
      // Union only supports string and table.
      std::string field_type;
      switch (ev.union_type.base_type) {
        case BASE_TYPE_STRUCT:
          field_type = namer_.ObjectType(*ev.union_type.struct_def);
          if (parser_.opts.include_dependence_headers) {
            auto package_reference = GenPackageReference(ev.union_type);
            field_type = package_reference + "." + field_type;
            import_list->insert("import " + package_reference);
          }
          break;
        case BASE_TYPE_STRING: field_type += "str"; break;
        case BASE_TYPE_NONE: field_type += "None"; break;
        default: break;
      }
      field_types += field_type + separator_string;
    }

    // Removes the last separator_string.
    field_types.erase(field_types.length() - separator_string.size());
    field_types += "]";

    // Gets the import lists for the union.
    if (parser_.opts.include_dependence_headers) {
      const auto package_reference = GenPackageReference(field.value.type);
      import_list->insert("import " + package_reference);
    }
  }